

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.cpp
# Opt level: O2

bool __thiscall dap::json::JsonCppSerializer::serialize(JsonCppSerializer *this,object *v)

{
  bool bVar1;
  __node_base *p_Var2;
  JsonCppSerializer s;
  
  bVar1 = Json::Value::isObject(this->json);
  if (!bVar1) {
    Json::Value::Value((Value *)&s,objectValue);
    Json::Value::operator=(this->json,(Value *)&s);
    Json::Value::~Value((Value *)&s);
  }
  p_Var2 = &(v->_M_h)._M_before_begin;
  do {
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) break;
    s.json = Json::Value::operator[](this->json,(String *)(p_Var2 + 1));
    s.super_Serializer._vptr_Serializer = (_func_int **)&PTR__JsonCppSerializer_00abd738;
    s.ownsJson = false;
    s.removed = false;
    bVar1 = serialize(&s,(any *)(p_Var2 + 5));
    ~JsonCppSerializer(&s);
  } while (bVar1);
  return p_Var2 == (__node_base *)0x0;
}

Assistant:

bool JsonCppSerializer::serialize(const dap::object& v) {
  if (!json->isObject()) {
    *json = Json::Value(Json::objectValue);
  }
  for (auto& it : v) {
    JsonCppSerializer s(&(*json)[it.first]);
    if (!s.serialize(it.second)) {
      return false;
    }
  }
  return true;
}